

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urandom.cc
# Opt level: O2

void wait_for_entropy(void)

{
  long lVar1;
  int *piVar2;
  char *pcVar3;
  char *pcVar4;
  uint8_t dummy;
  
  if ((urandom_fd == -3) && (getrandom_ready == '\0')) {
    lVar1 = boringssl_getrandom(&dummy,1,1);
    if (lVar1 == -1) {
      piVar2 = __errno_location();
      if (*piVar2 != 0xb) goto LAB_0018e12e;
      pcVar3 = (char *)getauxval(0x1f);
      pcVar4 = "<unknown>";
      if (pcVar3 != (char *)0x0) {
        pcVar4 = pcVar3;
      }
      fprintf(_stderr,
              "%s: getrandom indicates that the entropy pool has not been initialized. Rather than continue with poor entropy, this process will block until entropy is available.\n"
              ,pcVar4);
      lVar1 = boringssl_getrandom(&dummy,1,0);
    }
    if (lVar1 != 1) {
LAB_0018e12e:
      perror("getrandom");
      abort();
    }
  }
  return;
}

Assistant:

static void wait_for_entropy(void) {
  int fd = urandom_fd;
  if (fd == kHaveGetrandom) {
    // |getrandom| and |getentropy| support blocking in |fill_with_entropy|
    // directly. For |getrandom|, we first probe with a non-blocking call to aid
    // debugging.
#if defined(USE_NR_getrandom)
    if (getrandom_ready) {
      // The entropy pool was already initialized in |init_once|.
      return;
    }

    uint8_t dummy;
    ssize_t getrandom_ret =
        boringssl_getrandom(&dummy, sizeof(dummy), GRND_NONBLOCK);
    if (getrandom_ret == -1 && errno == EAGAIN) {
      // Attempt to get the path of the current process to aid in debugging when
      // something blocks.
      const char *current_process = "<unknown>";
#if defined(OPENSSL_HAS_GETAUXVAL)
      const unsigned long getauxval_ret = getauxval(AT_EXECFN);
      if (getauxval_ret != 0) {
        current_process = (const char *)getauxval_ret;
      }
#endif

      fprintf(
          stderr,
          "%s: getrandom indicates that the entropy pool has not been "
          "initialized. Rather than continue with poor entropy, this process "
          "will block until entropy is available.\n",
          current_process);

      getrandom_ret =
          boringssl_getrandom(&dummy, sizeof(dummy), 0 /* no flags */);
    }

    if (getrandom_ret != 1) {
      perror("getrandom");
      abort();
    }
#endif  // USE_NR_getrandom
    return;
  }
}